

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

CharClass<unsigned_char> * __thiscall
Centaurus::CharClass<unsigned_char>::operator|=
          (CharClass<unsigned_char> *this,Range<unsigned_char> *r)

{
  Range<unsigned_char> local_40;
  CharClass<unsigned_char> local_30;
  
  local_40._vptr_Range = (_func_int **)&PTR__Range_0017ded0;
  local_40.m_start = r->m_start;
  local_40.m_end = r->m_end;
  operator|(&local_30,this,&local_40);
  std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
  _M_move_assign(&this->m_ranges,&local_30.m_ranges);
  ~CharClass(&local_30);
  return this;
}

Assistant:

CharClass<TCHAR>& operator|=(const Range<TCHAR>& r)
    {
        return *this = *this | r;
    }